

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::UTF8InSourceTest::prepareNextTestCase
          (UTF8InSourceTest *this,GLuint test_case_index)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  GLchar *local_1b8 [3];
  MessageBuilder local_1a0;
  GLuint local_1c;
  UTF8InSourceTest *pUStack_18;
  GLuint test_case_index_local;
  UTF8InSourceTest *this_local;
  
  if (test_case_index == 0xffffffff) {
    this->m_character = EMPTY;
  }
  else {
    if (5 < test_case_index) {
      return false;
    }
    this->m_character = prepareNextTestCase::test_cases[test_case_index];
  }
  local_1c = test_case_index;
  pUStack_18 = this;
  this_00 = deqp::Context::getTestContext(*(Context **)&this->field_0x70);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [28])"Test case: utf8 character: ");
  local_1b8[0] = Utils::getUtf8Character(this->m_character);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return true;
}

Assistant:

bool UTF8InSourceTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	static const Utils::UTF8_CHARACTERS test_cases[] = {
		Utils::TWO_BYTES,  Utils::THREE_BYTES, Utils::FOUR_BYTES,
		Utils::FIVE_BYTES, Utils::SIX_BYTES,   Utils::REDUNDANT_ASCII
	};

	static const GLuint max_test_cases = sizeof(test_cases) / sizeof(Utils::UTF8_CHARACTERS);

	if ((GLuint)-1 == test_case_index)
	{
		m_character = Utils::EMPTY;
	}
	else if (max_test_cases <= test_case_index)
	{
		return false;
	}
	else
	{
		m_character = test_cases[test_case_index];
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "Test case: utf8 character: " << Utils::getUtf8Character(m_character)
										<< tcu::TestLog::EndMessage;

	return true;
}